

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O1

stack<int,_std::deque<int,_std::allocator<int>_>_> * __thiscall
CP::stack<int>::remove_top
          (stack<int,_std::deque<int,_std::allocator<int>_>_> *__return_storage_ptr__,
          stack<int> *this,size_t K)

{
  _Elt_pointer piVar1;
  int *__args;
  iterator __args_00;
  vector<int,_std::allocator<int>_> v;
  int *local_38;
  iterator iStack_30;
  int *local_28;
  
  local_38 = (int *)0x0;
  iStack_30._M_current = (int *)0x0;
  local_28 = (int *)0x0;
  if (K != 0) {
    do {
      if (this->mSize == 0) break;
      __args = top(this);
      if (iStack_30._M_current == local_28) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_38,iStack_30,__args);
      }
      else {
        *iStack_30._M_current = *__args;
        iStack_30._M_current = iStack_30._M_current + 1;
      }
      this->mSize = this->mSize - 1;
      K = K - 1;
    } while (K != 0);
  }
  (__return_storage_ptr__->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (__return_storage_ptr__->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)__return_storage_ptr__,0);
  __args_00._M_current = iStack_30._M_current;
  if (local_38 != iStack_30._M_current) {
    while (__args_00._M_current = __args_00._M_current + -1, local_38 <= __args_00._M_current) {
      piVar1 = (__return_storage_ptr__->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (piVar1 == (__return_storage_ptr__->c).super__Deque_base<int,_std::allocator<int>_>._M_impl
                    .super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                  ((deque<int,std::allocator<int>> *)__return_storage_ptr__,__args_00._M_current);
      }
      else {
        *piVar1 = *__args_00._M_current;
        (__return_storage_ptr__->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur = piVar1 + 1;
      }
    }
  }
  if (local_38 != (int *)0x0) {
    operator_delete(local_38,(long)local_28 - (long)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::stack<T> CP::stack<T>::remove_top(size_t K) {
  //write your code here
  //
  //don't forget to return an std::stack
  std::vector<T> v;
  for (size_t i = 0; i < K; ++i) {
    if (mSize == 0) break;
    v.push_back(top());
    mSize--;
  }
  std::stack<T> s;
  if (v.empty()) return s;
  for (auto it = v.end() - 1; it >= v.begin(); --it) {
    s.push(*it);
  }
  return s;
}